

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.h
# Opt level: O1

void __thiscall CompilerContext::~CompilerContext(CompilerContext *this)

{
  SmallArray<CompilerStatistics::Timer,_16U>::~SmallArray(&(this->statistics).timers);
  SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::~SmallArray
            (&(this->instRegVmFinalizeCtx).fixupPoints);
  if ((this->instRegVmFinalizeCtx).regKillInfo.data != (uchar *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->instRegVmFinalizeCtx).constants.data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->instRegVmFinalizeCtx).cmds.data != (RegVmCmd *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->instRegVmFinalizeCtx).locations.data != (SynBase **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  ExpressionContext::~ExpressionContext(&this->exprCtx);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::~SmallDenseMap
            (&(this->parseCtx).nonFunctionDefinitionLocations);
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::~SmallDenseMap
            (&(this->parseCtx).nonTypeLocations);
  SmallArray<CompilerStatistics::Timer,_16U>::~SmallArray(&(this->parseCtx).statistics.timers);
  SmallArray<ErrorInfo_*,_4U>::~SmallArray(&(this->parseCtx).errorInfo);
  SmallArray<InplaceStr,_8U>::~SmallArray(&(this->parseCtx).activeImports);
  SmallArray<SynNamespaceElement_*,_32U>::~SmallArray(&(this->parseCtx).namespaceList);
  SmallArray<SynBinaryOpElement,_32U>::~SmallArray(&(this->parseCtx).binaryOpStack);
  SmallArray<Lexeme,_32U>::~SmallArray(&(this->parseCtx).lexer.lexems);
  OutputContext::~OutputContext(&this->outputCtx);
  return;
}

Assistant:

CompilerContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): allocator(allocator), parseCtx(allocator, optimizationLevel, activeImports), exprCtx(allocator, optimizationLevel), instRegVmFinalizeCtx(exprCtx, allocator), optimizationLevel(optimizationLevel)
	{
		code = 0;

		moduleRoot = 0;

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		synModule = 0;

		exprModule = 0;
		exprMemoryLimit = 0;

		vmModule = 0;

		llvmModule = 0;

		regVmLoweredModule = 0;

		enableLogFiles = false;
	}